

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

int __thiscall userinfo_t::TeamChanged(userinfo_t *this,int team)

{
  uint intval;
  bool bVar1;
  FBaseCVar **ppFVar2;
  FName local_18;
  uint local_14;
  userinfo_t *puStack_10;
  int team_local;
  userinfo_t *this_local;
  
  local_14 = team;
  puStack_10 = this;
  bVar1 = FBoolCVar::operator_cast_to_bool(&teamplay);
  if ((bVar1) && (bVar1 = FTeam::IsValidTeam(&TeamLibrary,local_14), !bVar1)) {
    local_14 = D_PickRandomTeam();
  }
  intval = local_14;
  FName::FName(&local_18,NAME_Team);
  ppFVar2 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,&local_18);
  FIntCVar::operator=((FIntCVar *)*ppFVar2,intval);
  return local_14;
}

Assistant:

int userinfo_t::TeamChanged(int team)
{
	if (teamplay && !TeamLibrary.IsValidTeam(team))
	{ // Force players onto teams in teamplay mode
		team = D_PickRandomTeam();
	}
	*static_cast<FIntCVar *>((*this)[NAME_Team]) = team;
	return team;
}